

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int match_class(int c,int cl)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = tolower(cl);
  switch(iVar1) {
  case 0x61:
    uVar2 = isalpha(c);
    break;
  default:
    return (uint)(cl == c);
  case 99:
    uVar2 = iscntrl(c);
    break;
  case 100:
    uVar2 = (uint)(c - 0x30U < 10);
    break;
  case 0x67:
    uVar2 = isgraph(c);
    break;
  case 0x6c:
    uVar2 = islower(c);
    break;
  case 0x70:
    uVar2 = ispunct(c);
    break;
  case 0x73:
    uVar2 = isspace(c);
    break;
  case 0x75:
    uVar2 = isupper(c);
    break;
  case 0x77:
    uVar2 = isalnum(c);
    break;
  case 0x78:
    uVar2 = isxdigit(c);
    break;
  case 0x7a:
    uVar2 = (uint)(c == 0);
  }
  iVar1 = islower(cl);
  uVar3 = (uint)(uVar2 == 0);
  if (iVar1 != 0) {
    uVar3 = uVar2;
  }
  return uVar3;
}

Assistant:

static int match_class (int c, int cl) {
  int res;
  switch (tolower(cl)) {
    case 'a' : res = isalpha(c); break;
    case 'c' : res = iscntrl(c); break;
    case 'd' : res = isdigit(c); break;
    case 'g' : res = isgraph(c); break;
    case 'l' : res = islower(c); break;
    case 'p' : res = ispunct(c); break;
    case 's' : res = isspace(c); break;
    case 'u' : res = isupper(c); break;
    case 'w' : res = isalnum(c); break;
    case 'x' : res = isxdigit(c); break;
    case 'z' : res = (c == 0); break;  /* deprecated option */
    default: return (cl == c);
  }
  return (islower(cl) ? res : !res);
}